

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O2

void __thiscall
helics::apps::AsioBrokerServer::startServer
          (AsioBrokerServer *this,json *val,shared_ptr<helics::apps::TypedBrokerServer> *param_2)

{
  string_view message;
  string_view message_00;
  undefined1 *puVar1;
  long *plVar2;
  thread in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  puVar1 = null_abi_cxx11_;
  if (val != (json *)0x0) {
    puVar1 = (undefined1 *)val;
  }
  this->config_ = (json *)puVar1;
  if (this->tcp_enabled_ == true) {
    message._M_str = in_stack_ffffffffffffffe0;
    message._M_len = (size_t)in_stack_ffffffffffffffd8._M_id._M_thread;
    TypedBrokerServer::logMessage(message);
  }
  if (this->udp_enabled_ == true) {
    message_00._M_str = in_stack_ffffffffffffffe0;
    message_00._M_len = (size_t)in_stack_ffffffffffffffd8._M_id._M_thread;
    TypedBrokerServer::logMessage(message_00);
  }
  CLI::std::mutex::lock((mutex *)&this->threadGuard);
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR___State_004c0308;
  plVar2[1] = (long)this;
  std::thread::_M_start_thread(&stack0xffffffffffffffd8,&stack0xffffffffffffffe0,0);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  CLI::std::thread::operator=((thread *)&this->mainLoopThread,(thread *)&stack0xffffffffffffffd8);
  CLI::std::thread::~thread((thread *)&stack0xffffffffffffffd8);
  pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  return;
}

Assistant:

void AsioBrokerServer::startServer(const nlohmann::json* val,
                                       const std::shared_ptr<TypedBrokerServer>& /*ptr*/)
    {
        config_ = (val != nullptr) ? val : &null;

        if (tcp_enabled_) {
            logMessage("starting tcp broker server");
        }
        if (udp_enabled_) {
            logMessage("starting udp broker server");
        }
        std::lock_guard<std::mutex> tlock(threadGuard);
        mainLoopThread = std::thread([this]() { mainLoop(); });
    }